

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O2

void __thiscall duckdb::SQLStatement::SQLStatement(SQLStatement *this,SQLStatement *other)

{
  idx_t iVar1;
  undefined7 uVar2;
  
  this->_vptr_SQLStatement = (_func_int **)&PTR__SQLStatement_0278dc58;
  uVar2 = *(undefined7 *)&other->field_0x9;
  iVar1 = other->stmt_location;
  this->type = other->type;
  *(undefined7 *)&this->field_0x9 = uVar2;
  this->stmt_location = iVar1;
  this->stmt_length = other->stmt_length;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->named_param_map)._M_h,&(other->named_param_map)._M_h);
  ::std::__cxx11::string::string((string *)&this->query,(string *)&other->query);
  return;
}

Assistant:

SQLStatement(const SQLStatement &other) = default;